

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

char * lua_getupvalue(lua_State *L,int funcindex,int n)

{
  StkId pTVar1;
  undefined4 uVar2;
  TValue *fi;
  char *pcVar3;
  TValue *io1;
  TValue *val;
  char *name;
  int n_local;
  int funcindex_local;
  lua_State *L_local;
  
  io1 = (TValue *)0x0;
  name._0_4_ = n;
  name._4_4_ = funcindex;
  _n_local = L;
  fi = index2addr(L,funcindex);
  pcVar3 = aux_upvalue(fi,(int)name,&io1,(CClosure **)0x0,(UpVal **)0x0);
  if (pcVar3 != (char *)0x0) {
    pTVar1 = _n_local->top;
    pTVar1->value_ = io1->value_;
    uVar2 = *(undefined4 *)&io1->field_0xc;
    pTVar1->tt_ = io1->tt_;
    *(undefined4 *)&pTVar1->field_0xc = uVar2;
    _n_local->top = _n_local->top + 1;
  }
  return pcVar3;
}

Assistant:

LUA_API const char *lua_getupvalue (lua_State *L, int funcindex, int n) {
  const char *name;
  TValue *val = NULL;  /* to avoid warnings */
  lua_lock(L);
  name = aux_upvalue(index2addr(L, funcindex), n, &val, NULL, NULL);
  if (name) {
    setobj2s(L, L->top, val);
    api_incr_top(L);
  }
  lua_unlock(L);
  return name;
}